

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O1

REF_STATUS ref_phys_cc_fv_res(REF_GRID ref_grid,REF_INT nequ,REF_DBL *flux,REF_DBL *res)

{
  double dVar1;
  int iVar2;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_STATUS RVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  REF_INT cell;
  int iVar8;
  REF_DBL cell_vol;
  REF_DBL *xyzs [4];
  REF_DBL flux_grad [3];
  REF_DBL tet_flux [4];
  REF_INT nodes [27];
  double local_110;
  REF_DBL *local_108 [4];
  REF_DBL local_e8 [4];
  REF_DBL local_c8 [4];
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[8];
  if (0 < ref_cell->max) {
    cell = 0;
    do {
      RVar3 = ref_cell_nodes(ref_cell,cell,local_a8);
      if (RVar3 == 0) {
        iVar8 = ref_cell->node_per;
        if (0 < (long)iVar8) {
          lVar5 = 0;
          do {
            local_108[lVar5] = ref_node->real + (long)local_a8[lVar5] * 0xf;
            lVar5 = lVar5 + 1;
          } while (iVar8 != lVar5);
        }
        uVar4 = ref_node_xyz_vol(local_108,&local_110);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x201,"ref_phys_cc_fv_res",(ulong)uVar4,"vol");
          return uVar4;
        }
        lVar5 = 0;
        do {
          if (0 < nequ) {
            iVar8 = 0;
            do {
              iVar2 = ref_cell->node_per;
              if (0 < (long)iVar2) {
                lVar6 = 0;
                do {
                  local_c8[lVar6] = flux[(local_a8[lVar6] * 3 + (int)lVar5) * nequ + iVar8];
                  lVar6 = lVar6 + 1;
                } while (iVar2 != lVar6);
              }
              uVar4 = ref_node_xyz_grad(local_108,local_c8,local_e8);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                       ,0x208,"ref_phys_cc_fv_res",(ulong)uVar4,"grad");
                return uVar4;
              }
              iVar2 = ref_cell->node_per;
              if (0 < (long)iVar2) {
                dVar1 = local_e8[lVar5];
                lVar6 = 0;
                do {
                  iVar7 = local_a8[lVar6] * nequ + iVar8;
                  res[iVar7] = res[iVar7] + dVar1 * 0.25 * local_110;
                  lVar6 = lVar6 + 1;
                } while (iVar2 != lVar6);
              }
              iVar8 = iVar8 + 1;
            } while (iVar8 != nequ);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
      }
      cell = cell + 1;
    } while (cell < ref_cell->max);
  }
  uVar4 = ref_node_ghost_dbl(ref_node,res,nequ);
  if (uVar4 == 0) {
    uVar4 = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x211,
           "ref_phys_cc_fv_res",(ulong)uVar4,"ghost res");
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_phys_cc_fv_res(REF_GRID ref_grid, REF_INT nequ,
                                      REF_DBL *flux, REF_DBL *res) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT equ, dir, cell, cell_node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL cell_vol, flux_grad[3];
  REF_DBL tet_flux[4], *xyzs[4];

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    each_ref_cell_cell_node(ref_cell, cell_node) {
      xyzs[cell_node] = ref_node_xyz_ptr(ref_node, nodes[cell_node]);
    }
    RSS(ref_node_xyz_vol(xyzs, &cell_vol), "vol");
    for (dir = 0; dir < 3; dir++) {
      for (equ = 0; equ < nequ; equ++) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          tet_flux[cell_node] =
              flux[equ + dir * nequ + 3 * nequ * nodes[cell_node]];
        }
        RSS(ref_node_xyz_grad(xyzs, tet_flux, flux_grad), "grad");
        each_ref_cell_cell_node(ref_cell, cell_node) {
          res[equ + nequ * nodes[cell_node]] +=
              0.25 * flux_grad[dir] * cell_vol;
        }
      }
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, res, nequ), "ghost res");

  return REF_SUCCESS;
}